

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_convert_tile_tint
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int *in_R8;
  int in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  long ii;
  int *idata;
  int *in_stack_00000018;
  int flagval;
  long local_60;
  int local_4;
  
  if (((((int)ii != 0x20) || (in_XMM0_Qa != 1.0)) || (NAN(in_XMM0_Qa))) ||
     ((in_XMM1_Qa != 0.0 || (NAN(in_XMM1_Qa))))) {
    ffpmsg((char *)0x1f500a);
    *in_stack_00000018 = 0x19d;
    local_4 = 0x19d;
  }
  else {
    *idata = 4;
    if ((in_ECX == 1) && (iVar1 = *in_R8, iVar1 != in_R9D)) {
      for (local_60 = in_RDX + -1; -1 < local_60; local_60 = local_60 + -1) {
        if (*(int *)(in_RSI + local_60 * 4) == iVar1) {
          *(int *)(in_RSI + local_60 * 4) = in_R9D;
        }
      }
    }
    local_4 = *in_stack_00000018;
  }
  return local_4;
}

Assistant:

int imcomp_convert_tile_tint(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input integer tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, do null value substitution. */
   
    int flagval, *idata;
    long ii;
    
 
        /* datatype of input array is int.  We only support writing this datatype
           to a FITS image with BITPIX = 32 and with BZERO = 0 and BSCALE = 1.  */

       if (zbitpix != LONG_IMG || scale != 1.0 || zero != 0.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

       idata = (int *) tiledata;
       *intlength = 4;

       if (nullcheck == 1) {
               /* no datatype conversion is required for any of the compression algorithms,
	         except possibly for HCOMPRESS (to I*8), which is handled later.
		 Just reset pixels equal to flagval to the FITS null value */
               flagval = *(int *) (nullflagval);
               if (flagval != nullval) {
                  for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (idata[ii] == flagval)
		       idata[ii] = nullval;
                  }
               }
       }

       return(*status);
}